

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_repair(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  undefined1 auVar7 [16];
  REF_FACE pRVar8;
  uint uVar9;
  REF_STATUS RVar10;
  void *__ptr;
  long lVar11;
  REF_CELL *ppRVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  undefined8 uVar15;
  long lVar16;
  REF_STATUS ref_private_macro_code_rss;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  char *pcVar21;
  REF_NODE pRVar22;
  REF_GRID pRVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  REF_INT cell0;
  int local_1ac;
  REF_INT face_nodes [4];
  REF_INT new_node;
  REF_INT nodes [4];
  REF_FACE ref_face;
  REF_INT new_cell;
  REF_GRID local_160;
  REF_INT cell1;
  int local_150;
  REF_BOOL split_face;
  void *local_148;
  REF_NODE local_140;
  REF_CELL *local_138;
  REF_CELL *local_130;
  long local_128;
  REF_GLOB global;
  REF_INT tri_face;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT hex_nodes [27];
  
  pRVar22 = ref_grid->node;
  uVar9 = ref_face_create(&ref_face,ref_grid);
  pRVar8 = ref_face;
  if (uVar9 == 0) {
    if ((long)ref_face->n < 0) {
      pcVar21 = "malloc hits of REF_INT negative";
      uVar15 = 0x229;
LAB_001e5e21:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             uVar15,"ref_validation_repair",pcVar21);
      return 1;
    }
    __ptr = malloc((long)ref_face->n << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x229,"ref_validation_repair","malloc hits of REF_INT NULL");
      return 2;
    }
    for (lVar11 = 0; local_1ac = (int)lVar11, lVar11 < pRVar8->n; lVar11 = lVar11 + 1) {
      *(undefined4 *)((long)__ptr + lVar11 * 4) = 0;
    }
    local_130 = ref_grid->cell;
    ppRVar12 = ref_grid->cell + 8;
    lVar11 = 8;
    local_160 = ref_grid;
    local_140 = pRVar22;
    local_138 = ppRVar12;
    while (lVar11 != 0x10) {
      pRVar3 = *ppRVar12;
      iVar14 = 0;
      local_128 = lVar11;
      while (iVar14 < pRVar3->max) {
        local_150 = iVar14;
        if (pRVar3->c2n[(long)pRVar3->size_per * (long)iVar14] != -1) {
          for (lVar11 = 0; lVar11 < pRVar3->face_per; lVar11 = lVar11 + 1) {
            pRVar4 = pRVar3->c2n;
            pRVar5 = pRVar3->f2n;
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              nodes[lVar16] =
                   pRVar4[(long)pRVar3->size_per * (long)iVar14 +
                          (long)pRVar5[(ulong)((uint)lVar11 & 0x3fffffff) * 4 + lVar16]];
            }
            uVar9 = ref_face_with(ref_face,nodes,&local_1ac);
            if (uVar9 != 0) {
              uVar17 = (ulong)uVar9;
              pcVar21 = "find cell face";
              uVar15 = 0x233;
              goto LAB_001e5c8e;
            }
            piVar1 = (int *)((long)__ptr + (long)local_1ac * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        iVar14 = local_150 + 1;
      }
      ppRVar12 = local_130 + local_128 + 1;
      lVar11 = local_128 + 1;
    }
    pRVar3 = local_160->cell[3];
    for (iVar14 = 0; iVar14 < pRVar3->max; iVar14 = iVar14 + 1) {
      pRVar4 = pRVar3->c2n;
      if (pRVar4[(long)pRVar3->size_per * (long)iVar14] != -1) {
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          nodes[lVar11] = pRVar4[(long)pRVar3->size_per * (long)iVar14 + lVar11];
        }
        nodes[3] = nodes[0];
        uVar9 = ref_face_with(ref_face,nodes,&local_1ac);
        pRVar23 = local_160;
        if (uVar9 != 0) {
          uVar17 = (ulong)uVar9;
          ref_node_location(local_160->node,nodes[0]);
          ref_node_location(pRVar23->node,nodes[1]);
          ref_node_location(pRVar23->node,nodes[2]);
          ref_node_location(pRVar23->node,nodes[3]);
          pcVar21 = "find tri";
          uVar15 = 0x246;
          goto LAB_001e5c8e;
        }
        piVar1 = (int *)((long)__ptr + (long)local_1ac * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    pRVar3 = local_160->cell[6];
    for (iVar14 = 0; iVar14 < pRVar3->max; iVar14 = iVar14 + 1) {
      pRVar4 = pRVar3->c2n;
      if (pRVar4[(long)pRVar3->size_per * (long)iVar14] != -1) {
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          nodes[lVar11] = pRVar4[(long)pRVar3->size_per * (long)iVar14 + lVar11];
        }
        uVar9 = ref_face_with(ref_face,nodes,&local_1ac);
        if (uVar9 != 0) {
          uVar17 = (ulong)uVar9;
          pcVar21 = "find qua";
          uVar15 = 0x24f;
          goto LAB_001e5c8e;
        }
        piVar1 = (int *)((long)__ptr + (long)local_1ac * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    pRVar22 = local_140;
    pRVar23 = local_160;
    local_148 = __ptr;
    for (local_1ac = 0; local_1ac < ref_face->n; local_1ac = local_1ac + 1) {
      iVar14 = *(int *)((long)__ptr + (long)local_1ac * 4);
      if (pRVar23->mpi->n < 2) {
LAB_001e5fed:
        if (iVar14 != 2) {
LAB_001e5ff6:
          printf(" hits %d\n");
          pRVar4 = ref_face->f2n;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            nodes[lVar11] = pRVar4[local_1ac * 4 + lVar11];
          }
          printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n");
          uVar9 = ref_node_location(pRVar23->node,nodes[0]);
          if (uVar9 != 0) {
            uVar17 = (ulong)uVar9;
            pcVar21 = "n0";
            uVar15 = 0x26c;
            goto LAB_001e5c8e;
          }
          uVar9 = ref_node_location(pRVar23->node,nodes[1]);
          if (uVar9 != 0) {
            uVar17 = (ulong)uVar9;
            pcVar21 = "n1";
            uVar15 = 0x26d;
            goto LAB_001e5c8e;
          }
          uVar9 = ref_node_location(pRVar23->node,nodes[2]);
          if (uVar9 != 0) {
            uVar17 = (ulong)uVar9;
            pcVar21 = "n2";
            uVar15 = 0x26e;
            goto LAB_001e5c8e;
          }
          uVar9 = ref_node_location(pRVar23->node,nodes[3]);
          if (uVar9 != 0) {
            uVar17 = (ulong)uVar9;
            pcVar21 = "n3";
            uVar15 = 0x26f;
            goto LAB_001e5c8e;
          }
          __ptr = local_148;
          if (nodes[0] != nodes[3]) {
            pRVar3 = pRVar23->cell[0xb];
            puts("have quad");
            uVar9 = ref_cell_with_face(pRVar3,nodes,&cell0,&cell1);
            if (uVar9 != 0) {
              uVar17 = (ulong)uVar9;
              pcVar21 = "hex";
              uVar15 = 0x277;
              goto LAB_001e5c8e;
            }
            printf("hexes %d %d\n",(ulong)(uint)cell0,(ulong)(uint)cell1);
            if (cell0 == -1) {
              pcVar21 = "cant find hex";
              uVar15 = 0x279;
              goto LAB_001e5e21;
            }
            if ((long)cell1 != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x27a,"ref_validation_repair","found 2 hex",0xffffffffffffffff,(long)cell1);
              return 1;
            }
            uVar9 = ref_cell_nodes(pRVar3,cell0,hex_nodes);
            if (uVar9 != 0) {
              uVar17 = (ulong)uVar9;
              pcVar21 = "hex";
              uVar15 = 0x27b;
              goto LAB_001e5c8e;
            }
            uVar9 = ref_node_next_global(pRVar22,&global);
            if (uVar9 != 0) {
              uVar17 = (ulong)uVar9;
              pcVar21 = "next global";
              uVar15 = 0x27c;
              goto LAB_001e5c8e;
            }
            uVar9 = ref_node_add(pRVar22,global,&new_node);
            if (uVar9 != 0) {
              uVar17 = (ulong)uVar9;
              pcVar21 = "new node";
              uVar15 = 0x27d;
              goto LAB_001e5c8e;
            }
            pRVar6 = pRVar22->real;
            lVar11 = (long)new_node;
            pRVar6[lVar11 * 0xf] = 0.0;
            (pRVar6 + lVar11 * 0xf)[1] = 0.0;
            pRVar6[lVar11 * 0xf + 2] = 0.0;
            uVar9 = pRVar3->node_per;
            uVar17 = 0;
            if (0 < (int)uVar9) {
              uVar17 = (ulong)uVar9;
            }
            pauVar13 = (undefined1 (*) [16])(pRVar6 + lVar11 * 0xf);
            auVar25 = ZEXT816(0);
            dVar24 = 0.0;
            for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
              iVar14 = hex_nodes[uVar19];
              dVar26 = auVar25._8_8_;
              auVar25._0_8_ = auVar25._0_8_ + pRVar6[(long)iVar14 * 0xf];
              auVar25._8_8_ = dVar26 + (pRVar6 + (long)iVar14 * 0xf)[1];
              *pauVar13 = auVar25;
              dVar24 = dVar24 + pRVar6[(long)iVar14 * 0xf + 2];
              *(double *)pauVar13[1] = dVar24;
            }
            dVar26 = (double)(int)uVar9;
            auVar7._8_8_ = dVar26;
            auVar7._0_8_ = dVar26;
            auVar25 = divpd(auVar25,auVar7);
            *pauVar13 = auVar25;
            *(double *)pauVar13[1] = dVar24 / dVar26;
            lVar16 = 0;
            lVar11 = 0;
            while( true ) {
              pRVar23 = local_160;
              if (pRVar3->face_per <= lVar11) break;
              pRVar4 = pRVar3->f2n;
              pRVar5 = pRVar3->c2n;
              lVar18 = (long)pRVar3->size_per * (long)cell0;
              face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
              lVar18 = (long)(int)lVar18;
              face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 4) + lVar18];
              face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 8) + lVar18];
              face_nodes[3] =
                   pRVar5[(long)pRVar3->size_per * (long)cell0 +
                          (long)*(int *)((long)pRVar4 + lVar16 + 0xc)];
              uVar9 = ref_sort_same(4,nodes,face_nodes,&split_face);
              if (uVar9 != 0) {
                uVar17 = (ulong)uVar9;
                pcVar21 = "same";
                uVar15 = 0x298;
                goto LAB_001e5c8e;
              }
              if (split_face == 0) {
                pRVar4 = pRVar3->f2n;
                pRVar5 = pRVar3->c2n;
                lVar20 = (long)cell0;
                lVar18 = pRVar3->size_per * lVar20;
                tri_face = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
                local_10c = pRVar5[(long)(int)lVar18 + (long)*(int *)((long)pRVar4 + lVar16 + 4)];
                local_108 = pRVar5[pRVar3->size_per * lVar20 +
                                   (long)*(int *)((long)pRVar4 + lVar16 + 8)];
                local_114 = pRVar5[pRVar3->size_per * lVar20 +
                                   (long)*(int *)((long)pRVar4 + lVar16 + 0xc)];
                local_110 = new_node;
                uVar9 = ref_cell_add(local_160->cell[9],&tri_face,&new_cell);
                if (uVar9 != 0) {
                  uVar17 = (ulong)uVar9;
                  pcVar21 = "pyr";
                  uVar15 = 0x2c7;
                  goto LAB_001e5c8e;
                }
              }
              else {
                pRVar4 = pRVar3->f2n;
                pRVar5 = pRVar3->c2n;
                lVar18 = (long)cell0 * (long)pRVar3->size_per;
                face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
                lVar18 = (long)(int)lVar18;
                face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 4) + lVar18];
                face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 8) + lVar18];
                face_nodes[3] = face_nodes[0];
                RVar10 = ref_face_with(ref_face,face_nodes,&tri_face);
                ppRVar12 = local_138;
                if (RVar10 == 0) {
                  pRVar4 = pRVar3->f2n;
                  pRVar5 = pRVar3->c2n;
                  lVar18 = (long)cell0 * (long)pRVar3->size_per;
                  face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
                  lVar18 = (long)(int)lVar18;
                  face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 4) + lVar18];
                  face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 8) + lVar18];
                  face_nodes[3] = new_node;
                  uVar9 = ref_cell_add(*local_138,face_nodes,&new_cell);
                  if (uVar9 != 0) {
                    uVar17 = (ulong)uVar9;
                    pcVar21 = "tet";
                    uVar15 = 0x2a5;
                    goto LAB_001e5c8e;
                  }
                  pRVar4 = pRVar3->f2n;
                  pRVar5 = pRVar3->c2n;
                  lVar18 = (long)cell0 * (long)pRVar3->size_per;
                  face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
                  lVar18 = (long)(int)lVar18;
                  face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 8) + lVar18];
                  face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 0xc) + lVar18];
                  face_nodes[3] = new_node;
                  uVar9 = ref_cell_add(*ppRVar12,face_nodes,&new_cell);
                  if (uVar9 != 0) {
                    uVar17 = (ulong)uVar9;
                    pcVar21 = "tet";
                    uVar15 = 0x2ab;
                    goto LAB_001e5c8e;
                  }
                }
                pRVar4 = pRVar3->f2n;
                pRVar5 = pRVar3->c2n;
                lVar18 = (long)cell0 * (long)pRVar3->size_per;
                face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
                lVar18 = (long)(int)lVar18;
                face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 4) + lVar18];
                face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 0xc) + lVar18];
                face_nodes[3] = face_nodes[0];
                RVar10 = ref_face_with(ref_face,face_nodes,&tri_face);
                ppRVar12 = local_138;
                if (RVar10 == 0) {
                  pRVar4 = pRVar3->f2n;
                  pRVar5 = pRVar3->c2n;
                  lVar18 = (long)cell0 * (long)pRVar3->size_per;
                  face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16) + lVar18];
                  lVar18 = (long)(int)lVar18;
                  face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 4) + lVar18];
                  face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 0xc) + lVar18];
                  face_nodes[3] = new_node;
                  uVar9 = ref_cell_add(*local_138,face_nodes,&new_cell);
                  if (uVar9 != 0) {
                    uVar17 = (ulong)uVar9;
                    pcVar21 = "tet";
                    uVar15 = 0x2b7;
                    goto LAB_001e5c8e;
                  }
                  pRVar4 = pRVar3->f2n;
                  pRVar5 = pRVar3->c2n;
                  lVar18 = (long)cell0 * (long)pRVar3->size_per;
                  face_nodes[0] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 4) + lVar18];
                  lVar18 = (long)(int)lVar18;
                  face_nodes[1] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 8) + lVar18];
                  face_nodes[2] = pRVar5[*(int *)((long)pRVar4 + lVar16 + 0xc) + lVar18];
                  face_nodes[3] = new_node;
                  uVar9 = ref_cell_add(*ppRVar12,face_nodes,&new_cell);
                  if (uVar9 != 0) {
                    uVar17 = (ulong)uVar9;
                    pcVar21 = "tet";
                    uVar15 = 0x2bd;
                    goto LAB_001e5c8e;
                  }
                }
              }
              lVar11 = lVar11 + 1;
              lVar16 = lVar16 + 0x10;
            }
            uVar9 = ref_cell_remove(local_160->cell[0xb],cell0);
            __ptr = local_148;
            pRVar22 = local_140;
            if (uVar9 != 0) {
              uVar17 = (ulong)uVar9;
              pcVar21 = "hex";
              uVar15 = 0x2ca;
              goto LAB_001e5c8e;
            }
          }
        }
      }
      else {
        pRVar4 = pRVar22->part;
        iVar2 = pRVar22->ref_mpi->id;
        pRVar5 = ref_face->f2n;
        uVar9 = local_1ac << 2;
        if (((iVar2 == pRVar4[pRVar5[(int)uVar9]]) || (iVar2 == pRVar4[pRVar5[(int)(uVar9 | 1)]]))
           || (iVar2 == pRVar4[pRVar5[(int)(uVar9 | 2)]])) goto LAB_001e5fed;
        if ((iVar2 == pRVar4[pRVar5[(int)(uVar9 | 3)]]) && (iVar14 < 3)) {
          if (1 < iVar14) goto LAB_001e66dc;
          goto LAB_001e5ff6;
        }
        if ((iVar2 == pRVar4[pRVar5[(int)(uVar9 | 3)]]) || (2 < iVar14)) goto LAB_001e5ff6;
      }
LAB_001e66dc:
    }
    free(__ptr);
    uVar9 = ref_face_free(ref_face);
    if (uVar9 == 0) {
      return 0;
    }
    uVar17 = (ulong)uVar9;
    pcVar21 = "face free";
    uVar15 = 0x2d1;
  }
  else {
    uVar17 = (ulong)uVar9;
    pcVar21 = "face";
    uVar15 = 0x227;
  }
LAB_001e5c8e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar15,"ref_validation_repair",uVar17,pcVar21);
  return (REF_STATUS)uVar17;
}

Assistant:

REF_FCN REF_STATUS ref_validation_repair(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL report;
  REF_STATUS code;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    RSS(ref_face_with(ref_face, nodes, &face), "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
      if (nodes[0] != nodes[3]) {
        REF_INT cell0, cell1;
        REF_INT hex_nodes[REF_CELL_MAX_SIZE_PER];
        REF_GLOB global;
        REF_INT new_node, cell_node;
        ref_cell = ref_grid_hex(ref_grid);
        printf("have quad\n");
        RSS(ref_cell_with_face(ref_cell, nodes, &cell0, &cell1), "hex");
        printf("hexes %d %d\n", cell0, cell1);
        RUS(REF_EMPTY, cell0, "cant find hex");
        REIS(REF_EMPTY, cell1, "found 2 hex");
        RSS(ref_cell_nodes(ref_cell, cell0, hex_nodes), "hex");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        ref_node_xyz(ref_node, 0, new_node) = 0.0;
        ref_node_xyz(ref_node, 1, new_node) = 0.0;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
        each_ref_cell_cell_node(ref_cell, cell_node) {
          ref_node_xyz(ref_node, 0, new_node) +=
              ref_node_xyz(ref_node, 0, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 1, new_node) +=
              ref_node_xyz(ref_node, 1, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 2, new_node) +=
              ref_node_xyz(ref_node, 2, hex_nodes[cell_node]);
        }
        ref_node_xyz(ref_node, 0, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 1, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 2, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        each_ref_cell_cell_face(ref_cell, cell_face) {
          REF_INT face_nodes[4];
          REF_BOOL split_face;
          REF_INT new_cell;

          face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
          face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
          face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
          face_nodes[3] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
          RSS(ref_sort_same(4, nodes, face_nodes, &split_face), "same");
          if (split_face) {
            REF_INT tri_face;
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
          } else {
            REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
            pyr_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            pyr_nodes[3] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            pyr_nodes[4] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            pyr_nodes[1] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            pyr_nodes[2] = new_node;
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
                "pyr");
          }
        }
        RSS(ref_cell_remove(ref_grid_hex(ref_grid), cell0), "hex");
      }
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return REF_SUCCESS;
}